

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O1

void idx2::Dealloc(encode_data *E)

{
  allocator *paVar1;
  long lVar2;
  long lVar3;
  channel *C;
  chunk_exp_info *Ce;
  long lVar4;
  chunk_meta_info *pcVar5;
  long lVar6;
  sub_channel *psVar7;
  
  (*E->Alloc->_vptr_allocator[2])();
  Dealloc<unsigned_long,idx2::brick_volume>(&E->BrickPool);
  lVar2 = (E->Channels).LogCapacity;
  lVar6 = 1L << ((byte)lVar2 & 0x3f);
  lVar4 = lVar6;
  if (lVar2 != 0x3f) {
    lVar3 = 0;
    lVar2 = 0;
    if (0 < lVar6) {
      lVar2 = lVar6;
    }
    do {
      lVar4 = lVar3;
      if ((E->Channels).Stats[lVar3] == Occupied) break;
      lVar3 = lVar3 + 1;
      lVar4 = lVar6;
    } while (lVar2 + 1 != lVar3);
  }
  if (lVar4 != 1L << ((byte)(E->Channels).LogCapacity & 0x3f)) {
    C = (E->Channels).Vals + lVar4;
    do {
      Dealloc(C);
      lVar2 = lVar4 * -0xd8;
      do {
        lVar2 = lVar2 + -0xd8;
        lVar6 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ((E->Channels).Stats[lVar6] != Occupied);
      C = (channel *)((long)(E->Channels).Vals - lVar2);
    } while (1L << ((byte)(E->Channels).LogCapacity & 0x3f) != lVar4);
  }
  Dealloc<unsigned_int,idx2::channel>(&E->Channels);
  lVar2 = (E->SubChannels).LogCapacity;
  lVar6 = 1L << ((byte)lVar2 & 0x3f);
  lVar4 = lVar6;
  if (lVar2 != 0x3f) {
    lVar3 = 0;
    lVar2 = 0;
    if (0 < lVar6) {
      lVar2 = lVar6;
    }
    do {
      lVar4 = lVar3;
      if ((E->SubChannels).Stats[lVar3] == Occupied) break;
      lVar3 = lVar3 + 1;
      lVar4 = lVar6;
    } while (lVar2 + 1 != lVar3);
  }
  if (lVar4 != 1L << ((byte)(E->SubChannels).LogCapacity & 0x3f)) {
    psVar7 = (E->SubChannels).Vals + lVar4;
    do {
      paVar1 = (psVar7->BlockExpStream).Stream.Alloc;
      (*paVar1->_vptr_allocator[1])(paVar1,psVar7);
      paVar1 = (psVar7->BrickExpStream).Stream.Alloc;
      (psVar7->BlockExpStream).BitPtr = (psVar7->BlockExpStream).Stream.Data;
      (psVar7->BlockExpStream).BitPos = 0;
      (psVar7->BlockExpStream).BitBuf = 0;
      (*paVar1->_vptr_allocator[1])(paVar1,&psVar7->BrickExpStream);
      (psVar7->BrickExpStream).BitPtr = (psVar7->BrickExpStream).Stream.Data;
      (psVar7->BrickExpStream).BitPos = 0;
      (psVar7->BrickExpStream).BitBuf = 0;
      lVar2 = lVar4 * -0x70;
      do {
        lVar2 = lVar2 + -0x70;
        lVar6 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ((E->SubChannels).Stats[lVar6] != Occupied);
      psVar7 = (sub_channel *)((long)(E->SubChannels).Vals - lVar2);
    } while (1L << ((byte)(E->SubChannels).LogCapacity & 0x3f) != lVar4);
  }
  Dealloc<unsigned_long,idx2::sub_channel>(&E->SubChannels);
  paVar1 = (E->SortedChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedChannels);
  (E->SortedChannels).Size = 0;
  (E->SortedChannels).Capacity = 0;
  paVar1 = (E->SortedSubChannels).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SortedSubChannels);
  (E->SortedSubChannels).Size = 0;
  (E->SortedSubChannels).Capacity = 0;
  lVar2 = (E->ChunkMeta).LogCapacity;
  lVar6 = 1L << ((byte)lVar2 & 0x3f);
  lVar4 = lVar6;
  if (lVar2 != 0x3f) {
    lVar3 = 0;
    lVar2 = 0;
    if (0 < lVar6) {
      lVar2 = lVar6;
    }
    do {
      lVar4 = lVar3;
      if ((E->ChunkMeta).Stats[lVar3] == Occupied) break;
      lVar3 = lVar3 + 1;
      lVar4 = lVar6;
    } while (lVar2 + 1 != lVar3);
  }
  if (lVar4 != 1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f)) {
    pcVar5 = (E->ChunkMeta).Vals + lVar4;
    do {
      paVar1 = (pcVar5->Addrs).Alloc;
      (*paVar1->_vptr_allocator[1])(paVar1,pcVar5);
      (pcVar5->Addrs).Size = 0;
      (pcVar5->Addrs).Capacity = 0;
      paVar1 = (pcVar5->Sizes).Stream.Alloc;
      (*paVar1->_vptr_allocator[1])(paVar1,&pcVar5->Sizes);
      (pcVar5->Sizes).BitPtr = (pcVar5->Sizes).Stream.Data;
      (pcVar5->Sizes).BitPos = 0;
      (pcVar5->Sizes).BitBuf = 0;
      lVar2 = lVar4 * -0x60;
      do {
        lVar2 = lVar2 + -0x60;
        lVar6 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ((E->ChunkMeta).Stats[lVar6] != Occupied);
      pcVar5 = (chunk_meta_info *)((long)(E->ChunkMeta).Vals - lVar2);
    } while (1L << ((byte)(E->ChunkMeta).LogCapacity & 0x3f) != lVar4);
  }
  lVar2 = (E->ChunkExponents).LogCapacity;
  lVar6 = 1L << ((byte)lVar2 & 0x3f);
  lVar4 = lVar6;
  if (lVar2 != 0x3f) {
    lVar3 = 0;
    lVar2 = 0;
    if (0 < lVar6) {
      lVar2 = lVar6;
    }
    do {
      lVar4 = lVar3;
      if ((E->ChunkExponents).Stats[lVar3] == Occupied) break;
      lVar3 = lVar3 + 1;
      lVar4 = lVar6;
    } while (lVar2 + 1 != lVar3);
  }
  if (lVar4 != 1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f)) {
    Ce = (E->ChunkExponents).Vals + lVar4;
    do {
      Dealloc(Ce);
      lVar2 = lVar4 * -0x90;
      do {
        lVar2 = lVar2 + -0x90;
        lVar6 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ((E->ChunkExponents).Stats[lVar6] != Occupied);
      Ce = (chunk_exp_info *)((long)(E->ChunkExponents).Vals - lVar2);
    } while (1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f) != lVar4);
  }
  Dealloc<unsigned_long,idx2::chunk_meta_info>(&E->ChunkMeta);
  paVar1 = (E->CompressedChunkAddresses).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->CompressedChunkAddresses);
  paVar1 = (E->ChunkStream).Stream.Alloc;
  (E->CompressedChunkAddresses).BitPtr = (E->CompressedChunkAddresses).Stream.Data;
  (E->CompressedChunkAddresses).BitPos = 0;
  (E->CompressedChunkAddresses).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkStream);
  paVar1 = (E->ChunkExpStream).Stream.Alloc;
  (E->ChunkStream).BitPtr = (E->ChunkStream).Stream.Data;
  (E->ChunkStream).BitPos = 0;
  (E->ChunkStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->ChunkExpStream);
  paVar1 = (E->LastSigBlock).Alloc;
  (E->ChunkExpStream).BitPtr = (E->ChunkExpStream).Stream.Data;
  (E->ChunkExpStream).BitPos = 0;
  (E->ChunkExpStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->LastSigBlock);
  (E->LastSigBlock).Size = 0;
  (E->LastSigBlock).Capacity = 0;
  paVar1 = (E->SubbandExps).Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,&E->SubbandExps);
  (E->SubbandExps).Size = 0;
  (E->SubbandExps).Capacity = 0;
  return;
}

Assistant:

void
Dealloc(encode_data* E)
{
  E->Alloc->DeallocAll();
  Dealloc(&E->BrickPool);
  idx2_ForEach (ChannelIt, E->Channels)
    Dealloc(ChannelIt.Val);
  Dealloc(&E->Channels);
  idx2_ForEach (SubChannelIt, E->SubChannels)
    Dealloc(SubChannelIt.Val);
  Dealloc(&E->SubChannels);
  Dealloc(&E->SortedChannels);
  Dealloc(&E->SortedSubChannels);
  idx2_ForEach (ChunkMetaIt, E->ChunkMeta)
    Dealloc(ChunkMetaIt.Val);
  idx2_ForEach (ChunkExpIt, E->ChunkExponents)
    Dealloc(ChunkExpIt.Val);
  Dealloc(&E->ChunkMeta);
  //Dealloc(&E->CompressedExps);
  Dealloc(&E->CompressedChunkAddresses);
  Dealloc(&E->ChunkStream);
  Dealloc(&E->ChunkExpStream);
  Dealloc(&E->LastSigBlock);
  Dealloc(&E->SubbandExps);
  //Dealloc(&E->BlockStream);
}